

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sq.cpp
# Opt level: O0

void dumpBytecodeAst_callback(HSQUIRRELVM vm,HSQOBJECT obj,void *opts)

{
  HSQOBJECT obj_00;
  HSQOBJECT obj_01;
  bool bVar1;
  SQOuter *in_RCX;
  SQObjectValue in_RDX;
  undefined8 in_RSI;
  FileOutputStream fos_1;
  FileOutputStream fos;
  DumpOptions *dumpOpt;
  FILE *in_stack_ffffffffffffff58;
  HSQUIRRELVM in_stack_ffffffffffffff60;
  HSQUIRRELVM v;
  undefined8 in_stack_ffffffffffffff68;
  SQObjectValue in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  FileOutputStream *in_stack_ffffffffffffff80;
  SQOuter *local_28;
  SQObjectType local_10;
  SQObjectFlags SStack_c;
  undefined3 uStack_b;
  SQObjectValue SStack_8;
  
  if ((in_RCX != (SQOuter *)0x0) &&
     (((ulong)(in_RCX->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted & 0x100) != 0)) {
    if ((in_RCX->super_SQCollectable).super_SQRefCounted._weakref == (SQWeakRef *)0x0) {
      v = (HSQUIRRELVM)&stack0xffffffffffffff80;
      _local_10 = in_RSI;
      SStack_8 = in_RDX;
      FileOutputStream::FileOutputStream((FileOutputStream *)v,in_stack_ffffffffffffff58);
      obj_01._unVal.pTable = SStack_8.pTable;
      obj_01._type = local_10;
      obj_01._flags = SStack_c;
      obj_01._5_3_ = uStack_b;
      sq_dumpbytecode(v,obj_01,(OutputStream *)in_stack_ffffffffffffff58);
      FileOutputStream::~FileOutputStream((FileOutputStream *)v);
    }
    else {
      local_28 = in_RCX;
      FileOutputStream::FileOutputStream(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      bVar1 = FileOutputStream::valid((FileOutputStream *)&stack0xffffffffffffffc0);
      if (bVar1) {
        obj_00._unVal.pTable = in_stack_ffffffffffffff70.pTable;
        obj_00._type = (int)in_stack_ffffffffffffff68;
        obj_00._flags = (char)((ulong)in_stack_ffffffffffffff68 >> 0x20);
        obj_00._5_3_ = (int3)((ulong)in_stack_ffffffffffffff68 >> 0x28);
        sq_dumpbytecode(in_stack_ffffffffffffff60,obj_00,(OutputStream *)in_stack_ffffffffffffff58);
      }
      else {
        printf("Error: cannot open Bytecode dump file \'%s\'\n",
               (local_28->super_SQCollectable).super_SQRefCounted._weakref);
      }
      FileOutputStream::~FileOutputStream((FileOutputStream *)in_stack_ffffffffffffff60);
    }
  }
  return;
}

Assistant:

static void dumpBytecodeAst_callback(HSQUIRRELVM vm, HSQOBJECT obj, void *opts)
{
    if (opts == NULL)
      return;
    DumpOptions *dumpOpt = (DumpOptions *)opts;
    if (dumpOpt->bytecodeDump)
    {
        if (dumpOpt->bytecodeDumpFileName)
        {
            FileOutputStream fos(dumpOpt->bytecodeDumpFileName);
            if (fos.valid())
            {
                sq_dumpbytecode(vm, obj, &fos);
            }
            else
            {
                printf(_SC("Error: cannot open Bytecode dump file '%s'\n"), dumpOpt->bytecodeDumpFileName);
            }
        }
        else
        {
            FileOutputStream fos(stdout);
            sq_dumpbytecode(vm, obj, &fos);
        }
    }
}